

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

reference __thiscall
jsoncons::jsonpath::detail::
function_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(function_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  supertype *psVar1;
  int iVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  undefined4 extraout_var;
  undefined4 in_register_0000008c;
  value_type ref;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_40;
  
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate((token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&local_40,
             (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&this->expr_,(reference)context,root,(result_options)current,
             (error_code *)CONCAT44(in_register_0000008c,options));
  if (ec->_M_value == 0) {
    pbVar3 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
             ::create_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                       ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                         *)context,&local_40);
    psVar1 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar1 != (supertype *)0x0) {
      iVar2 = (*psVar1->_vptr_jsonpath_selector[3])(psVar1,context,root,last,pbVar3,options,ec);
      pbVar3 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ::null_value(context);
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_40);
  return pbVar3;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            value_type ref = expr_.evaluate(context, root, current, options, ec);
            if (!ec)
            {
                return this->evaluate_tail(context, root, last, *context.create_json(std::move(ref)), 
                    options, ec);
            }
            return context.null_value();
        }